

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

int __thiscall Fl_Text_Display::move_left(Fl_Text_Display *this)

{
  bool bVar1;
  int iVar2;
  Fl_Text_Buffer *this_00;
  int q;
  int p;
  Fl_Text_Display *this_local;
  
  bVar1 = 0 < this->mCursorPos;
  if (bVar1) {
    iVar2 = insert_position(this);
    this_00 = buffer(this);
    iVar2 = Fl_Text_Buffer::prev_char_clipped(this_00,iVar2);
    insert_position(this,iVar2);
  }
  this_local._4_4_ = (uint)bVar1;
  return this_local._4_4_;
}

Assistant:

int Fl_Text_Display::move_left() {
  if ( mCursorPos <= 0 )
    return 0;
  int p = insert_position();
  int q = buffer()->prev_char_clipped(p);
  insert_position(q);
  return 1;
}